

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
clickhouse::SliceVector<int>(vector<int,_std::allocator<int>_> *vec,size_t begin,size_t len)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_iterator __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *result;
  vector<int,_std::allocator<int>_> *__n;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa8;
  unsigned_long local_30;
  undefined1 local_21;
  unsigned_long local_20;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_21 = 0;
  __n = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2149be);
  this = local_18;
  p_Var1 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
           std::vector<int,_std::allocator<int>_>::size(local_10);
  if (this < p_Var1) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_10);
    local_30 = sVar2 - (long)local_18;
    puVar3 = std::min<unsigned_long>(&local_20,&local_30);
    local_20 = *puVar3;
    std::vector<int,_std::allocator<int>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (this,(difference_type)__n);
    __first = std::vector<int,_std::allocator<int>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (this,(difference_type)__n);
    std::vector<int,std::allocator<int>>::
    assign<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
              (in_stack_ffffffffffffffa0,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               __first._M_current,in_stack_ffffffffffffffa8);
  }
  return __n;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}